

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorPool::DeferredValidation::DeferredValidation
          (DeferredValidation *this,DescriptorPool *pool,ErrorCollector *error_collector)

{
  FileDescriptorProto *pFVar1;
  ErrorCollector *error_collector_local;
  DescriptorPool *pool_local;
  DeferredValidation *this_local;
  
  Arena::Arena(&this->arena_,this->initial_buffer_,0x200);
  pFVar1 = Arena::Create<google::protobuf::FileDescriptorProto>(&this->arena_);
  this->first_proto_ = pFVar1;
  this->pool_ = pool;
  this->error_collector_ = error_collector;
  absl::lts_20250127::
  flat_hash_map<const_google::protobuf::FileDescriptor_*,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>_>_>
  ::flat_hash_map(&this->lifetimes_info_map_);
  return;
}

Assistant:

DeferredValidation(const DescriptorPool* pool,
                     ErrorCollector* error_collector)
      : pool_(pool), error_collector_(error_collector) {}